

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall tokenizer::add_token_to_stream(tokenizer *this,Token_Type type)

{
  undefined1 local_48 [8];
  Token new_token;
  Token_Type type_local;
  tokenizer *this_local;
  
  new_token.value.field_2._12_4_ = type;
  Token::Token((Token *)local_48);
  new_token.line_number = new_token.value.field_2._12_4_;
  local_48._0_4_ = this->last_line_number;
  local_48._4_4_ = this->last_position_number;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_token.type,
             &this->current_word);
  std::vector<Token,_std::allocator<Token>_>::push_back(this->token_stream,(value_type *)local_48);
  Token::~Token((Token *)local_48);
  return;
}

Assistant:

void tokenizer::add_token_to_stream(Token_Type type) {
    Token new_token;
    new_token.type = type;
    new_token.line_number = this->last_line_number;
    new_token.position_number = this->last_position_number;
    new_token.value = this->current_word;

    this->token_stream->push_back(new_token);
}